

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O2

void __thiscall
duckdb::InternalApproxTopKState::Initialize(InternalApproxTopKState *this,idx_t kval)

{
  __uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_> __p;
  tuple<duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_> in_RAX;
  uint64_t __new_size;
  __uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_> local_18
  ;
  
  this->k = kval;
  this->capacity = kval * 3;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
  .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl =
       (tuple<duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>)
       (tuple<duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>)
       in_RAX.
       super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
       .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl;
  make_unsafe_uniq_array_uninitialized<duckdb::ApproxTopKValue>((duckdb *)&local_18,kval * 3);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
  .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
       .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
  .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl =
       (tuple<duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>)
       (_Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
       )0x0;
  ::std::__uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_>::
  reset((__uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_> *
        )this,(pointer)__p._M_t.
                       super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
                       .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>::
  ~unique_ptr((unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>
               *)&local_18);
  ::std::
  vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
  ::reserve(&(this->values).
             super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
            ,this->capacity);
  __new_size = NextPowerOfTwo(this->capacity << 3);
  this->filter_mask = __new_size - 1;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&(this->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,__new_size)
  ;
  return;
}

Assistant:

void Initialize(idx_t kval) {
		static constexpr idx_t MONITORED_VALUES_RATIO = 3;
		static constexpr idx_t FILTER_RATIO = 8;

		D_ASSERT(values.empty());
		D_ASSERT(lookup_map.empty());
		k = kval;
		capacity = kval * MONITORED_VALUES_RATIO;
		stored_values = make_unsafe_uniq_array_uninitialized<ApproxTopKValue>(capacity);
		values.reserve(capacity);

		// we scale the filter based on the amount of values we are monitoring
		idx_t filter_size = NextPowerOfTwo(capacity * FILTER_RATIO);
		filter_mask = filter_size - 1;
		filter.resize(filter_size);
	}